

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O0

ContextInternal * Args::details::makeContext_abi_cxx11_(int argc,char **argv)

{
  long in_RDX;
  int in_ESI;
  ContextInternal *in_RDI;
  int i;
  ContextInternal *context;
  value_type *__x;
  allocator *this;
  allocator local_41;
  string local_40 [32];
  int local_20;
  undefined1 local_19;
  long local_18;
  int local_c;
  
  local_19 = 0;
  local_18 = in_RDX;
  local_c = in_ESI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x105439);
  for (local_20 = 1; local_20 < local_c; local_20 = local_20 + 1) {
    __x = *(value_type **)(local_18 + (long)local_20 * 8);
    this = &local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,(char *)__x,this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,__x);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return in_RDI;
}

Assistant:

makeContext( int argc, const char * const * argv )
#endif
{
	ContextInternal context;

	// We skip first argv because of it's executable name.
	for( int i = 1; i < argc; ++i )
		context.push_back( argv[ i ] );

	return context;
}